

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O0

void __thiscall Scs::Client::Run(Client *this)

{
  bool bVar1;
  Status SVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *this_00;
  element_type *this_01;
  size_type sVar5;
  uchar *puVar6;
  shared_ptr<Scs::Socket> local_190;
  undefined1 local_180 [16];
  undefined1 local_170 [8];
  BufferPtr receivedData;
  size_t bytesReceived;
  shared_ptr<Scs::Socket> local_150;
  _Elt_pointer local_140;
  duration<long,_std::ratio<1L,_1000L>_> local_138;
  undefined1 local_130 [20];
  int local_11c;
  duration<long,_std::ratio<1L,_1000L>_> local_118 [2];
  shared_ptr<Scs::Address> local_108;
  shared_ptr<Scs::Socket> local_f8;
  int local_e4;
  duration<long,_std::ratio<1L,_1000L>_> local_e0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  time_point statusTime;
  ReceiveQueue receiveQueue;
  undefined1 local_30 [8];
  BufferPtr receiveBuffer;
  AddressPtr address;
  Client *this_local;
  
  CreateAddress((Scs *)&receiveBuffer.
                        super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,&this->m_port,&this->m_address);
  CreateBuffer();
  peVar3 = std::
           __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::reserve(peVar3,0x20000);
  ReceiveQueue::ReceiveQueue((ReceiveQueue *)&statusTime);
  local_d8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
LAB_0011def1:
  do {
    SVar2 = std::atomic::operator_cast_to_Status((atomic *)&this->m_status);
    if (SVar2 == Shutdown) {
LAB_0011e731:
      bVar1 = std::function::operator_cast_to_bool((function *)&this->m_onDisconnect);
      if (bVar1) {
        std::function<void_(Scs::IClient_&)>::operator()(&this->m_onDisconnect,&this->super_IClient)
        ;
      }
      std::shared_ptr<Scs::Socket>::shared_ptr(&local_190,(nullptr_t)0x0);
      std::shared_ptr<Scs::Socket>::operator=(&this->m_socket,&local_190);
      std::shared_ptr<Scs::Socket>::~shared_ptr(&local_190);
      ReceiveQueue::~ReceiveQueue((ReceiveQueue *)&statusTime);
      std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
                ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)local_30
                );
      std::shared_ptr<Scs::Address>::~shared_ptr
                ((shared_ptr<Scs::Address> *)
                 &receiveBuffer.
                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    local_e4 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_e0,&local_e4);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_e0);
    SVar2 = std::atomic::operator_cast_to_Status((atomic *)&this->m_status);
    if (SVar2 == Initial) {
      std::shared_ptr<Scs::Address>::shared_ptr
                (&local_108,
                 (shared_ptr<Scs::Address> *)
                 &receiveBuffer.
                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CreateSocket((Scs *)&local_f8,&local_108);
      std::shared_ptr<Scs::Socket>::operator=(&this->m_socket,&local_f8);
      std::shared_ptr<Scs::Socket>::~shared_ptr(&local_f8);
      std::shared_ptr<Scs::Address>::~shared_ptr(&local_108);
      peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socket);
      Socket::SetNonBlocking(peVar4,true);
      peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socket);
      bVar1 = Socket::Connect(peVar4);
      if (!bVar1) {
        LogWriteLine("Error connecting client socket.");
        std::atomic<Scs::Client::Status>::operator=(&this->m_status,Shutdown);
        std::atomic<bool>::operator=(&this->m_error,true);
        goto LAB_0011e731;
      }
      std::atomic<Scs::Client::Status>::operator=(&this->m_status,Connecting);
      local_118[1].__r = std::chrono::_V2::system_clock::now();
      local_11c = 100;
      local_d8.__d.__r = (duration)(duration)local_118[1].__r;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)local_118,&local_11c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_118);
      goto LAB_0011def1;
    }
    SVar2 = std::atomic::operator_cast_to_Status((atomic *)&this->m_status);
    if (SVar2 == Connecting) {
      local_130._8_8_ = std::chrono::_V2::system_clock::now();
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long_long,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_138,&this->m_timeoutMs);
      local_130._0_8_ = std::chrono::operator+(&local_d8,&local_138);
      bVar1 = std::chrono::operator>
                        ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)(local_130 + 8),
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)local_130);
      if (bVar1) {
        this_00 = std::__shared_ptr_access<Scs::Address,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Scs::Address,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&receiveBuffer.
                                 super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
        bVar1 = Address::Next(this_00);
        if (bVar1) {
          std::atomic<Scs::Client::Status>::operator=(&this->m_status,Initial);
          local_140 = (_Elt_pointer)std::chrono::_V2::system_clock::now();
          local_d8.__d.__r = (duration)(duration)local_140;
          LogWriteLine("Client failed to connect - trying next address.");
        }
        else {
          std::atomic<Scs::Client::Status>::operator=(&this->m_status,ConnectionTimeout);
          LogWriteLine("Client failed to connect.");
        }
      }
      else {
        peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_socket);
        bVar1 = Socket::IsWritable(peVar4);
        if (bVar1) {
          std::atomic<Scs::Client::Status>::operator=(&this->m_status,Ready);
          LogWriteLine("Client established connection with server.");
          bVar1 = std::function::operator_cast_to_bool((function *)&this->m_onConnect);
          if (bVar1) {
            std::function<void_(Scs::IClient_&)>::operator()
                      (&this->m_onConnect,&this->super_IClient);
          }
        }
      }
    }
    else {
      SVar2 = std::atomic::operator_cast_to_Status((atomic *)&this->m_status);
      if (SVar2 == ConnectionTimeout) {
        LogWriteLine("Client retry not yet implemented.  Shutting down client.");
        std::atomic<bool>::operator=(&this->m_error,true);
        std::atomic<Scs::Client::Status>::operator=(&this->m_status,Shutdown);
      }
      else {
        SVar2 = std::atomic::operator_cast_to_Status((atomic *)&this->m_status);
        if (SVar2 == Ready) {
          bVar1 = std::function::operator_cast_to_bool((function *)&this->m_onUpdate);
          if (bVar1) {
            std::function<void_(Scs::IClient_&)>::operator()(&this->m_onUpdate,&this->super_IClient)
            ;
          }
          peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_socket);
          bVar1 = Socket::IsWritable(peVar4);
          if ((bVar1) && (bVar1 = SendQueue::Empty(&this->m_sendQueue), !bVar1)) {
            std::shared_ptr<Scs::Socket>::shared_ptr(&local_150,&this->m_socket);
            bVar1 = SendQueue::Send(&this->m_sendQueue,&local_150);
            std::shared_ptr<Scs::Socket>::~shared_ptr(&local_150);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              LogWriteLine("Error sending data to server.  Shutting down connection.");
              std::atomic<Scs::Client::Status>::operator=(&this->m_status,Shutdown);
              goto LAB_0011e731;
            }
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
                      ((duration<long,std::ratio<1l,1000l>> *)&bytesReceived,&SEND_THROTTLE_MS);
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&bytesReceived);
          }
          peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_socket);
          bVar1 = Socket::IsReadable(peVar4);
          if (bVar1) {
            peVar3 = std::
                     __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_30);
            this_01 = std::
                      __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_30);
            sVar5 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::capacity(this_01);
            std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize(peVar3,sVar5);
            peVar4 = std::__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Scs::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_socket);
            peVar3 = std::
                     __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_30);
            puVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::data(peVar3);
            peVar3 = std::
                     __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_30);
            sVar5 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::capacity(peVar3);
            receivedData.
            super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 Socket::Receive(peVar4,puVar6,sVar5,0);
            if (receivedData.
                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              peVar3 = std::
                       __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                        (peVar3,(size_type)
                                receivedData.
                                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
              peVar3 = std::
                       __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              puVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::data(peVar3);
              peVar3 = std::
                       __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              sVar5 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar3);
              ReceiveQueue::Push((ReceiveQueue *)&statusTime,puVar6,sVar5);
              peVar3 = std::
                       __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::clear(peVar3);
              ReceiveQueue::Pop((ReceiveQueue *)local_170);
              while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_170),
                    bVar1) {
                bVar1 = std::function::operator_cast_to_bool((function *)&this->m_onReceiveData);
                if (bVar1) {
                  peVar3 = std::
                           __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_170);
                  puVar6 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::data(peVar3);
                  peVar3 = std::
                           __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_170);
                  sVar5 = std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::size(peVar3);
                  std::function<void_(Scs::IClient_&,_const_void_*,_unsigned_long)>::operator()
                            (&this->m_onReceiveData,&this->super_IClient,puVar6,sVar5);
                }
                ReceiveQueue::Pop((ReceiveQueue *)local_180);
                std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::
                operator=((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *
                          )local_170,
                          (shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *
                          )local_180);
                std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::
                ~shared_ptr((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>
                             *)local_180);
              }
              std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::
              ~shared_ptr((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *
                          )local_170);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void Client::Run()
{
	// Create address from port and address strings
	AddressPtr address = CreateAddress(m_port, m_address);

	// Create a receive buffer
	BufferPtr receiveBuffer = CreateBuffer();
	receiveBuffer->reserve(RECEIVE_BUFFER_SIZE);

	// Create a receive queue
	ReceiveQueue receiveQueue;

	// Mark initial time
	auto statusTime = std::chrono::system_clock::now();

	// Loop until we get a shutdown request
	while (m_status != Status::Shutdown)
	{
		// We don't want to burn too much CPU while idling.
		std::this_thread::sleep_for(std::chrono::milliseconds(1));

		if (m_status == Status::Initial)
		{
			m_socket = CreateSocket(address);
			m_socket->SetNonBlocking(true);
			if (!m_socket->Connect())
			{
				LogWriteLine("Error connecting client socket.");
				m_status = Status::Shutdown;
				m_error = true;
				break;
			}
			m_status = Status::Connecting;
			statusTime = std::chrono::system_clock::now();

            // On macOS, without this slight delay after a connect attempt, the socket returns immediate
            // success on IsWriteable(), even if no connection is present.
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
		}
		else if (m_status == Status::Connecting)
		{
			if (std::chrono::system_clock::now() > statusTime + std::chrono::milliseconds(m_timeoutMs))
			{
				if (address->Next())
				{
					m_status = Status::Initial;
					statusTime = std::chrono::system_clock::now();
					LogWriteLine("Client failed to connect - trying next address.");
				}
				else
				{
					m_status = Status::ConnectionTimeout;
					LogWriteLine("Client failed to connect.");
				}
			}
			else
			{
				if (m_socket->IsWritable())
				{
                    m_status = Status::Ready;
                    LogWriteLine("Client established connection with server.");
					if (m_onConnect)
						m_onConnect(*this);
				}
			}
		}
		else if (m_status == Status::ConnectionTimeout)
		{
			// TODO: Wait some period and try again for a limited number of tries.  For now, we just fail
			LogWriteLine("Client retry not yet implemented.  Shutting down client.");
			m_error = true;
			m_status = Status::Shutdown;
		}
		else if (m_status == Status::Ready)
		{
			if (m_onUpdate)
				m_onUpdate(*this);

			// Check first to see if we can write to the socket
			if (m_socket->IsWritable())
			{
				if (!m_sendQueue.Empty())
				{
					if (!m_sendQueue.Send(m_socket))
					{
						LogWriteLine("Error sending data to server.  Shutting down connection.");
						m_status = Status::Shutdown;
						break;
					}

					// We need to throttle our connection transmission rate
					std::this_thread::sleep_for(std::chrono::milliseconds(SEND_THROTTLE_MS));
				}
			}

			// Check for incoming data
			if (m_socket->IsReadable())
			{
				// Read data from socket
				receiveBuffer->resize(receiveBuffer->capacity());
				size_t bytesReceived = m_socket->Receive(receiveBuffer->data(), receiveBuffer->capacity(), 0);
				if (bytesReceived)
				{
					// Push data into the receive queue
					receiveBuffer->resize(bytesReceived);
					receiveQueue.Push(receiveBuffer->data(), receiveBuffer->size());
					receiveBuffer->clear();

					// Process data in receive queue
					BufferPtr receivedData = receiveQueue.Pop();
					while (receivedData)
					{
						if (m_onReceiveData)
							m_onReceiveData(*this, receivedData->data(), receivedData->size());
						receivedData = receiveQueue.Pop();
					}
				}
			}
		}
	}

	if (m_onDisconnect)
		m_onDisconnect(*this);
	m_socket = nullptr;
}